

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O2

GLenum Diligent::TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat,Uint32 BindFlags)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  string msg;
  string local_30;
  
  if ((TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)::FormatMap == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)
                                   ::FormatMap), iVar2 != 0)) {
    memset(&TexFormatToGLInternalTexFormat::FormatMap,0,0x1a8);
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[1] = 0x8814;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[2] = 0x8814;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[3] = 0x8d70;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[4] = 0x8d82;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[5] = 0x8815;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[6] = 0x8815;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[7] = 0x8d71;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[8] = 0x8d83;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[9] = 0x881a;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[10] = 0x881a;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xb] = 0x805b;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xc] = 0x8d76;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xd] = 0x8f9b;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xe] = 0x8d88;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xf] = 0x8230;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x10] = 0x8230;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x11] = 0x823c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x12] = 0x823b;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x13] = 0x8cad;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x14] = 0x8cad;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x15] = 0x8cad;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x17] = 0x8059;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x18] = 0x8059;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x19] = 0x906f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1a] = 0x8c3a;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1b] = 0x8058;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1c] = 0x8058;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1d] = 0x8c43;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1e] = 0x8d7c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1f] = 0x8f97;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x20] = 0x8d8e;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x21] = 0x822f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x22] = 0x822f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x23] = 0x822c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x24] = 0x823a;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x25] = 0x8f99;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x26] = 0x8239;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x27] = 0x822e;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x28] = 0x8cac;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x29] = 0x822e;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2a] = 0x8236;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2b] = 0x8235;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2c] = 0x88f0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2d] = 0x88f0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2e] = 0x88f0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x30] = 0x822b;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x31] = 0x822b;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x32] = 0x8238;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x33] = 0x8f95;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x34] = 0x8237;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x35] = 0x822d;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x36] = 0x822d;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x37] = 0x81a5;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x38] = 0x822a;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x39] = 0x8234;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3a] = 0x8f98;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3b] = 0x8233;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3c] = 0x8229;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3d] = 0x8229;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3e] = 0x8232;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3f] = 0x8f94;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x40] = 0x8231;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x41] = 0x8229;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x43] = 0x8c3d;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x46] = 0x83f0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x47] = 0x83f0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x48] = 0x8c4c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x49] = 0x83f2;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4a] = 0x83f2;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4b] = 0x8c4e;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4c] = 0x83f3;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4d] = 0x83f3;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4e] = 0x8c4f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4f] = 0x8dbb;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x50] = 0x8dbb;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x51] = 0x8dbc;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x52] = 0x8dbd;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x53] = 0x8dbd;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x54] = 0x8dbe;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x57] = 0x8058;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5c] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5d] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x58] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x59] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5a] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5b] = 0;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5e] = 0x8e8f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5f] = 0x8e8f;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x60] = 0x8e8e;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x61] = 0x8e8c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x62] = 0x8e8c;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[99] = 0x8e8d;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[100] = 0x9274;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x65] = 0x9275;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x66] = 0x9276;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x67] = 0x9277;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x68] = 0x9278;
    TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x69] = 0x9279;
    __cxa_guard_release(&TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)::
                         FormatMap);
  }
  if (TexFormat < TEX_FORMAT_NUM_FORMATS) {
    uVar1 = TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[TexFormat];
    if (BindFlags != 0) {
      uVar3 = 0x8cac;
      if (uVar1 != 0x822e) {
        uVar3 = uVar1;
      }
      uVar4 = 0x81a5;
      if (uVar3 != 0x822a) {
        uVar4 = uVar3;
      }
      if ((BindFlags & 0x40) != 0) {
        uVar1 = uVar4;
      }
    }
  }
  else {
    FormatString<char[17],int,char[31],int,char[2]>
              (&local_30,(Diligent *)"Texture format (",(char (*) [17])&stack0xffffffffffffffcc,
               (int *)") is out of allowed range [0, ",(char (*) [31])&stack0xffffffffffffffc8,
               (int *)0x7906e1,(char (*) [2])(ulong)CONCAT24(TexFormat,0x69));
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TexFormatToGLInternalTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)&local_30);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

GLenum TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat, Uint32 BindFlags)
{
    static const FormatToGLInternalTexFormatMap FormatMap;
    if (TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS)
    {
        auto GLFormat = FormatMap[TexFormat];
        if (BindFlags != 0)
            GLFormat = CorrectGLTexFormat(GLFormat, BindFlags);
        return GLFormat;
    }
    else
    {
        UNEXPECTED("Texture format (", int{TexFormat}, ") is out of allowed range [0, ", int{TEX_FORMAT_NUM_FORMATS} - 1, "]");
        return 0;
    }
}